

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  ulong uVar1;
  char *pcVar2;
  CURLcode CVar3;
  long lVar4;
  unsigned_long uVar5;
  char *pcVar6;
  size_t insize;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char *local_48;
  long local_40;
  size_t size;
  
  uVar5 = authstatus->picked;
  if (uVar5 == 1) {
    uVar1 = *(ulong *)&(conn->bits).field_0x4;
    if (proxy) {
      if (((uVar1 & 4) == 0) ||
         (pcVar9 = Curl_checkProxyheaders(data,conn,"Proxy-authorization"), pcVar9 != (char *)0x0))
      goto LAB_00121e17;
      lVar10 = 0x12e8;
      lVar4 = 0x1348;
      lVar7 = 0x1350;
LAB_00121f1c:
      size = 0;
      local_48 = (char *)0x0;
      pcVar9 = *(char **)((long)&data->magic + lVar7);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "";
      }
      pcVar9 = curl_maprintf("%s:%s",*(undefined8 *)((long)&data->magic + lVar4),pcVar9);
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      local_40 = lVar10;
      insize = strlen(pcVar9);
      CVar3 = Curl_base64_encode(data,pcVar9,insize,&local_48,&size);
      lVar4 = local_40;
      if (CVar3 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar3 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
          pcVar6 = "";
          if (proxy) {
            pcVar6 = "Proxy-";
          }
          pcVar6 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar6,local_48);
          *(char **)((long)&data->magic + lVar4) = pcVar6;
          (*Curl_cfree)(local_48);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&data->magic + lVar4) != 0) {
            CVar3 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar9);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar9 = "Basic";
    }
    else {
      if ((((uint)uVar1 >> 0xb & 1) != 0) &&
         (pcVar9 = Curl_checkheaders(data,"Authorization"), pcVar9 == (char *)0x0)) {
        lVar10 = 0x1300;
        lVar4 = 0x1338;
        lVar7 = 0x1340;
        goto LAB_00121f1c;
      }
LAB_00121e17:
      pcVar9 = (char *)0x0;
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  else if (uVar5 == 2) {
    CVar3 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar9 = "Digest";
  }
  else if (uVar5 == 8) {
    CVar3 = Curl_output_ntlm(data,proxy);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar9 = "NTLM";
  }
  else {
    if (uVar5 != 0x80) {
      pcVar9 = (char *)0x0;
      goto LAB_00121e2b;
    }
    CVar3 = Curl_output_aws_sigv4(data,proxy);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar9 = "AWS_SIGV4";
  }
  uVar5 = authstatus->picked;
LAB_00121e2b:
  if (uVar5 == 0x40) {
    if (((!proxy) && ((data->set).str[0x41] != (char *)0x0)) &&
       (pcVar6 = Curl_checkheaders(data,"Authorization"), pcVar6 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.userpwd);
      pcVar9 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x41]);
      (data->state).aptr.userpwd = pcVar9;
      if (pcVar9 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar9 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar9 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    pcVar6 = "Server";
    if (proxy) {
      pcVar6 = "Proxy";
    }
    pcVar2 = (&(data->state).aptr.user)[(ulong)proxy * 2];
    pcVar8 = "";
    if (pcVar2 != (char *)0x0) {
      pcVar8 = pcVar2;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar6,pcVar9,pcVar8);
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, "Proxy-authorization")) ||
#endif
      (!proxy && conn->bits.user_passwd &&
       !Curl_checkheaders(data, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, "Authorization"))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}